

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calibrateGyro.cpp
# Opt level: O0

void __thiscall
CalibrateGyro::CalibrateGyro
          (CalibrateGyro *this,string *OutputFile_Kinematic,string *OutputFile_Static)

{
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int i;
  VecVector3d accel_temp;
  VecVector3d *in_stack_00000448;
  VecVector3d *in_stack_00000450;
  string *in_stack_00000458;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_stack_fffffffffffffed8;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_stack_fffffffffffffee0;
  long local_d0;
  long local_b0;
  string local_88 [32];
  string local_68 [36];
  int local_44;
  long local_18;
  long local_10;
  
  local_b0 = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  do {
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)0x1a37b8);
    local_b0 = local_b0 + 0x18;
  } while (local_b0 != in_RDI + 0x90);
  local_d0 = in_RDI + 0x90;
  do {
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)0x1a380b);
    local_d0 = local_d0 + 0x18;
  } while (local_d0 != in_RDI + 0x120);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x1a3836);
  Eigen::Matrix<double,_3,_4,_0,_3,_4>::Matrix((Matrix<double,_3,_4,_0,_3,_4> *)0x1a3849);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)0x1a3858);
  for (local_44 = 0; local_44 < 6; local_44 = local_44 + 1) {
    std::__cxx11::string::string(local_68,(string *)(local_10 + (long)local_44 * 0x20));
    ReadASC(in_stack_00000458,in_stack_00000450,in_stack_00000448);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::string(local_88,(string *)(local_18 + (long)local_44 * 0x20));
    ReadASC(in_stack_00000458,in_stack_00000450,in_stack_00000448);
    std::__cxx11::string::~string(local_88);
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)0x1a3ab8);
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::swap(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::~vector(in_stack_fffffffffffffee0);
  }
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~vector(in_stack_fffffffffffffee0);
  return;
}

Assistant:

CalibrateGyro::CalibrateGyro(string* OutputFile_Kinematic, string* OutputFile_Static)
{
    VecVector3d accel_temp;
    for(int i = 0; i < 6; ++i)
    {
        try
        {
            ReadASC(OutputFile_Kinematic[i], accel_temp, this->Gyro_Kinematic[i]);
            ReadASC(OutputFile_Static[i], accel_temp, this->Gyro_Static[i]);
        }
        catch(...)
        {
            cout << "数组越界，请检查！" << endl;
        }
        vector<Vector3d, Eigen::aligned_allocator<Vector3d>>().swap(accel_temp);
    }
}